

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

array<unsigned_short,_256UL> *
adjust_freqs(array<unsigned_short,_256UL> *__return_storage_ptr__,array<unsigned_long,_256UL> *freqs
            )

{
  ushort uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  long lVar5;
  size_t sym;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 in_ZMM1 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  
  lVar5 = 0;
  lVar6 = 0;
  __return_storage_ptr__->_M_elems[0xe0] = 0;
  __return_storage_ptr__->_M_elems[0xe1] = 0;
  __return_storage_ptr__->_M_elems[0xe2] = 0;
  __return_storage_ptr__->_M_elems[0xe3] = 0;
  __return_storage_ptr__->_M_elems[0xe4] = 0;
  __return_storage_ptr__->_M_elems[0xe5] = 0;
  __return_storage_ptr__->_M_elems[0xe6] = 0;
  __return_storage_ptr__->_M_elems[0xe7] = 0;
  __return_storage_ptr__->_M_elems[0xe8] = 0;
  __return_storage_ptr__->_M_elems[0xe9] = 0;
  __return_storage_ptr__->_M_elems[0xea] = 0;
  __return_storage_ptr__->_M_elems[0xeb] = 0;
  __return_storage_ptr__->_M_elems[0xec] = 0;
  __return_storage_ptr__->_M_elems[0xed] = 0;
  __return_storage_ptr__->_M_elems[0xee] = 0;
  __return_storage_ptr__->_M_elems[0xef] = 0;
  __return_storage_ptr__->_M_elems[0xf0] = 0;
  __return_storage_ptr__->_M_elems[0xf1] = 0;
  __return_storage_ptr__->_M_elems[0xf2] = 0;
  __return_storage_ptr__->_M_elems[0xf3] = 0;
  __return_storage_ptr__->_M_elems[0xf4] = 0;
  __return_storage_ptr__->_M_elems[0xf5] = 0;
  __return_storage_ptr__->_M_elems[0xf6] = 0;
  __return_storage_ptr__->_M_elems[0xf7] = 0;
  __return_storage_ptr__->_M_elems[0xf8] = 0;
  __return_storage_ptr__->_M_elems[0xf9] = 0;
  __return_storage_ptr__->_M_elems[0xfa] = 0;
  __return_storage_ptr__->_M_elems[0xfb] = 0;
  __return_storage_ptr__->_M_elems[0xfc] = 0;
  __return_storage_ptr__->_M_elems[0xfd] = 0;
  __return_storage_ptr__->_M_elems[0xfe] = 0;
  __return_storage_ptr__->_M_elems[0xff] = 0;
  __return_storage_ptr__->_M_elems[0xc0] = 0;
  __return_storage_ptr__->_M_elems[0xc1] = 0;
  __return_storage_ptr__->_M_elems[0xc2] = 0;
  __return_storage_ptr__->_M_elems[0xc3] = 0;
  __return_storage_ptr__->_M_elems[0xc4] = 0;
  __return_storage_ptr__->_M_elems[0xc5] = 0;
  __return_storage_ptr__->_M_elems[0xc6] = 0;
  __return_storage_ptr__->_M_elems[199] = 0;
  __return_storage_ptr__->_M_elems[200] = 0;
  __return_storage_ptr__->_M_elems[0xc9] = 0;
  __return_storage_ptr__->_M_elems[0xca] = 0;
  __return_storage_ptr__->_M_elems[0xcb] = 0;
  __return_storage_ptr__->_M_elems[0xcc] = 0;
  __return_storage_ptr__->_M_elems[0xcd] = 0;
  __return_storage_ptr__->_M_elems[0xce] = 0;
  __return_storage_ptr__->_M_elems[0xcf] = 0;
  __return_storage_ptr__->_M_elems[0xd0] = 0;
  __return_storage_ptr__->_M_elems[0xd1] = 0;
  __return_storage_ptr__->_M_elems[0xd2] = 0;
  __return_storage_ptr__->_M_elems[0xd3] = 0;
  __return_storage_ptr__->_M_elems[0xd4] = 0;
  __return_storage_ptr__->_M_elems[0xd5] = 0;
  __return_storage_ptr__->_M_elems[0xd6] = 0;
  __return_storage_ptr__->_M_elems[0xd7] = 0;
  __return_storage_ptr__->_M_elems[0xd8] = 0;
  __return_storage_ptr__->_M_elems[0xd9] = 0;
  __return_storage_ptr__->_M_elems[0xda] = 0;
  __return_storage_ptr__->_M_elems[0xdb] = 0;
  __return_storage_ptr__->_M_elems[0xdc] = 0;
  __return_storage_ptr__->_M_elems[0xdd] = 0;
  __return_storage_ptr__->_M_elems[0xde] = 0;
  __return_storage_ptr__->_M_elems[0xdf] = 0;
  __return_storage_ptr__->_M_elems[0xa0] = 0;
  __return_storage_ptr__->_M_elems[0xa1] = 0;
  __return_storage_ptr__->_M_elems[0xa2] = 0;
  __return_storage_ptr__->_M_elems[0xa3] = 0;
  __return_storage_ptr__->_M_elems[0xa4] = 0;
  __return_storage_ptr__->_M_elems[0xa5] = 0;
  __return_storage_ptr__->_M_elems[0xa6] = 0;
  __return_storage_ptr__->_M_elems[0xa7] = 0;
  __return_storage_ptr__->_M_elems[0xa8] = 0;
  __return_storage_ptr__->_M_elems[0xa9] = 0;
  __return_storage_ptr__->_M_elems[0xaa] = 0;
  __return_storage_ptr__->_M_elems[0xab] = 0;
  __return_storage_ptr__->_M_elems[0xac] = 0;
  __return_storage_ptr__->_M_elems[0xad] = 0;
  __return_storage_ptr__->_M_elems[0xae] = 0;
  __return_storage_ptr__->_M_elems[0xaf] = 0;
  __return_storage_ptr__->_M_elems[0xb0] = 0;
  __return_storage_ptr__->_M_elems[0xb1] = 0;
  __return_storage_ptr__->_M_elems[0xb2] = 0;
  __return_storage_ptr__->_M_elems[0xb3] = 0;
  __return_storage_ptr__->_M_elems[0xb4] = 0;
  __return_storage_ptr__->_M_elems[0xb5] = 0;
  __return_storage_ptr__->_M_elems[0xb6] = 0;
  __return_storage_ptr__->_M_elems[0xb7] = 0;
  __return_storage_ptr__->_M_elems[0xb8] = 0;
  __return_storage_ptr__->_M_elems[0xb9] = 0;
  __return_storage_ptr__->_M_elems[0xba] = 0;
  __return_storage_ptr__->_M_elems[0xbb] = 0;
  __return_storage_ptr__->_M_elems[0xbc] = 0;
  __return_storage_ptr__->_M_elems[0xbd] = 0;
  __return_storage_ptr__->_M_elems[0xbe] = 0;
  __return_storage_ptr__->_M_elems[0xbf] = 0;
  __return_storage_ptr__->_M_elems[0x80] = 0;
  __return_storage_ptr__->_M_elems[0x81] = 0;
  __return_storage_ptr__->_M_elems[0x82] = 0;
  __return_storage_ptr__->_M_elems[0x83] = 0;
  __return_storage_ptr__->_M_elems[0x84] = 0;
  __return_storage_ptr__->_M_elems[0x85] = 0;
  __return_storage_ptr__->_M_elems[0x86] = 0;
  __return_storage_ptr__->_M_elems[0x87] = 0;
  __return_storage_ptr__->_M_elems[0x88] = 0;
  __return_storage_ptr__->_M_elems[0x89] = 0;
  __return_storage_ptr__->_M_elems[0x8a] = 0;
  __return_storage_ptr__->_M_elems[0x8b] = 0;
  __return_storage_ptr__->_M_elems[0x8c] = 0;
  __return_storage_ptr__->_M_elems[0x8d] = 0;
  __return_storage_ptr__->_M_elems[0x8e] = 0;
  __return_storage_ptr__->_M_elems[0x8f] = 0;
  __return_storage_ptr__->_M_elems[0x90] = 0;
  __return_storage_ptr__->_M_elems[0x91] = 0;
  __return_storage_ptr__->_M_elems[0x92] = 0;
  __return_storage_ptr__->_M_elems[0x93] = 0;
  __return_storage_ptr__->_M_elems[0x94] = 0;
  __return_storage_ptr__->_M_elems[0x95] = 0;
  __return_storage_ptr__->_M_elems[0x96] = 0;
  __return_storage_ptr__->_M_elems[0x97] = 0;
  __return_storage_ptr__->_M_elems[0x98] = 0;
  __return_storage_ptr__->_M_elems[0x99] = 0;
  __return_storage_ptr__->_M_elems[0x9a] = 0;
  __return_storage_ptr__->_M_elems[0x9b] = 0;
  __return_storage_ptr__->_M_elems[0x9c] = 0;
  __return_storage_ptr__->_M_elems[0x9d] = 0;
  __return_storage_ptr__->_M_elems[0x9e] = 0;
  __return_storage_ptr__->_M_elems[0x9f] = 0;
  __return_storage_ptr__->_M_elems[0x60] = 0;
  __return_storage_ptr__->_M_elems[0x61] = 0;
  __return_storage_ptr__->_M_elems[0x62] = 0;
  __return_storage_ptr__->_M_elems[99] = 0;
  __return_storage_ptr__->_M_elems[100] = 0;
  __return_storage_ptr__->_M_elems[0x65] = 0;
  __return_storage_ptr__->_M_elems[0x66] = 0;
  __return_storage_ptr__->_M_elems[0x67] = 0;
  __return_storage_ptr__->_M_elems[0x68] = 0;
  __return_storage_ptr__->_M_elems[0x69] = 0;
  __return_storage_ptr__->_M_elems[0x6a] = 0;
  __return_storage_ptr__->_M_elems[0x6b] = 0;
  __return_storage_ptr__->_M_elems[0x6c] = 0;
  __return_storage_ptr__->_M_elems[0x6d] = 0;
  __return_storage_ptr__->_M_elems[0x6e] = 0;
  __return_storage_ptr__->_M_elems[0x6f] = 0;
  __return_storage_ptr__->_M_elems[0x70] = 0;
  __return_storage_ptr__->_M_elems[0x71] = 0;
  __return_storage_ptr__->_M_elems[0x72] = 0;
  __return_storage_ptr__->_M_elems[0x73] = 0;
  __return_storage_ptr__->_M_elems[0x74] = 0;
  __return_storage_ptr__->_M_elems[0x75] = 0;
  __return_storage_ptr__->_M_elems[0x76] = 0;
  __return_storage_ptr__->_M_elems[0x77] = 0;
  __return_storage_ptr__->_M_elems[0x78] = 0;
  __return_storage_ptr__->_M_elems[0x79] = 0;
  __return_storage_ptr__->_M_elems[0x7a] = 0;
  __return_storage_ptr__->_M_elems[0x7b] = 0;
  __return_storage_ptr__->_M_elems[0x7c] = 0;
  __return_storage_ptr__->_M_elems[0x7d] = 0;
  __return_storage_ptr__->_M_elems[0x7e] = 0;
  __return_storage_ptr__->_M_elems[0x7f] = 0;
  __return_storage_ptr__->_M_elems[0x40] = 0;
  __return_storage_ptr__->_M_elems[0x41] = 0;
  __return_storage_ptr__->_M_elems[0x42] = 0;
  __return_storage_ptr__->_M_elems[0x43] = 0;
  __return_storage_ptr__->_M_elems[0x44] = 0;
  __return_storage_ptr__->_M_elems[0x45] = 0;
  __return_storage_ptr__->_M_elems[0x46] = 0;
  __return_storage_ptr__->_M_elems[0x47] = 0;
  __return_storage_ptr__->_M_elems[0x48] = 0;
  __return_storage_ptr__->_M_elems[0x49] = 0;
  __return_storage_ptr__->_M_elems[0x4a] = 0;
  __return_storage_ptr__->_M_elems[0x4b] = 0;
  __return_storage_ptr__->_M_elems[0x4c] = 0;
  __return_storage_ptr__->_M_elems[0x4d] = 0;
  __return_storage_ptr__->_M_elems[0x4e] = 0;
  __return_storage_ptr__->_M_elems[0x4f] = 0;
  __return_storage_ptr__->_M_elems[0x50] = 0;
  __return_storage_ptr__->_M_elems[0x51] = 0;
  __return_storage_ptr__->_M_elems[0x52] = 0;
  __return_storage_ptr__->_M_elems[0x53] = 0;
  __return_storage_ptr__->_M_elems[0x54] = 0;
  __return_storage_ptr__->_M_elems[0x55] = 0;
  __return_storage_ptr__->_M_elems[0x56] = 0;
  __return_storage_ptr__->_M_elems[0x57] = 0;
  __return_storage_ptr__->_M_elems[0x58] = 0;
  __return_storage_ptr__->_M_elems[0x59] = 0;
  __return_storage_ptr__->_M_elems[0x5a] = 0;
  __return_storage_ptr__->_M_elems[0x5b] = 0;
  __return_storage_ptr__->_M_elems[0x5c] = 0;
  __return_storage_ptr__->_M_elems[0x5d] = 0;
  __return_storage_ptr__->_M_elems[0x5e] = 0;
  __return_storage_ptr__->_M_elems[0x5f] = 0;
  __return_storage_ptr__->_M_elems[0x20] = 0;
  __return_storage_ptr__->_M_elems[0x21] = 0;
  __return_storage_ptr__->_M_elems[0x22] = 0;
  __return_storage_ptr__->_M_elems[0x23] = 0;
  __return_storage_ptr__->_M_elems[0x24] = 0;
  __return_storage_ptr__->_M_elems[0x25] = 0;
  __return_storage_ptr__->_M_elems[0x26] = 0;
  __return_storage_ptr__->_M_elems[0x27] = 0;
  __return_storage_ptr__->_M_elems[0x28] = 0;
  __return_storage_ptr__->_M_elems[0x29] = 0;
  __return_storage_ptr__->_M_elems[0x2a] = 0;
  __return_storage_ptr__->_M_elems[0x2b] = 0;
  __return_storage_ptr__->_M_elems[0x2c] = 0;
  __return_storage_ptr__->_M_elems[0x2d] = 0;
  __return_storage_ptr__->_M_elems[0x2e] = 0;
  __return_storage_ptr__->_M_elems[0x2f] = 0;
  __return_storage_ptr__->_M_elems[0x30] = 0;
  __return_storage_ptr__->_M_elems[0x31] = 0;
  __return_storage_ptr__->_M_elems[0x32] = 0;
  __return_storage_ptr__->_M_elems[0x33] = 0;
  __return_storage_ptr__->_M_elems[0x34] = 0;
  __return_storage_ptr__->_M_elems[0x35] = 0;
  __return_storage_ptr__->_M_elems[0x36] = 0;
  __return_storage_ptr__->_M_elems[0x37] = 0;
  __return_storage_ptr__->_M_elems[0x38] = 0;
  __return_storage_ptr__->_M_elems[0x39] = 0;
  __return_storage_ptr__->_M_elems[0x3a] = 0;
  __return_storage_ptr__->_M_elems[0x3b] = 0;
  __return_storage_ptr__->_M_elems[0x3c] = 0;
  __return_storage_ptr__->_M_elems[0x3d] = 0;
  __return_storage_ptr__->_M_elems[0x3e] = 0;
  __return_storage_ptr__->_M_elems[0x3f] = 0;
  __return_storage_ptr__->_M_elems[0] = 0;
  __return_storage_ptr__->_M_elems[1] = 0;
  __return_storage_ptr__->_M_elems[2] = 0;
  __return_storage_ptr__->_M_elems[3] = 0;
  __return_storage_ptr__->_M_elems[4] = 0;
  __return_storage_ptr__->_M_elems[5] = 0;
  __return_storage_ptr__->_M_elems[6] = 0;
  __return_storage_ptr__->_M_elems[7] = 0;
  __return_storage_ptr__->_M_elems[8] = 0;
  __return_storage_ptr__->_M_elems[9] = 0;
  __return_storage_ptr__->_M_elems[10] = 0;
  __return_storage_ptr__->_M_elems[0xb] = 0;
  __return_storage_ptr__->_M_elems[0xc] = 0;
  __return_storage_ptr__->_M_elems[0xd] = 0;
  __return_storage_ptr__->_M_elems[0xe] = 0;
  __return_storage_ptr__->_M_elems[0xf] = 0;
  __return_storage_ptr__->_M_elems[0x10] = 0;
  __return_storage_ptr__->_M_elems[0x11] = 0;
  __return_storage_ptr__->_M_elems[0x12] = 0;
  __return_storage_ptr__->_M_elems[0x13] = 0;
  __return_storage_ptr__->_M_elems[0x14] = 0;
  __return_storage_ptr__->_M_elems[0x15] = 0;
  __return_storage_ptr__->_M_elems[0x16] = 0;
  __return_storage_ptr__->_M_elems[0x17] = 0;
  __return_storage_ptr__->_M_elems[0x18] = 0;
  __return_storage_ptr__->_M_elems[0x19] = 0;
  __return_storage_ptr__->_M_elems[0x1a] = 0;
  __return_storage_ptr__->_M_elems[0x1b] = 0;
  __return_storage_ptr__->_M_elems[0x1c] = 0;
  __return_storage_ptr__->_M_elems[0x1d] = 0;
  __return_storage_ptr__->_M_elems[0x1e] = 0;
  __return_storage_ptr__->_M_elems[0x1f] = 0;
  for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
    lVar5 = lVar5 + freqs->_M_elems[lVar9];
    lVar6 = (lVar6 + 1) - (ulong)(freqs->_M_elems[lVar9] == 0);
  }
  uVar7 = lVar6 << 6;
  uVar10 = 0x1000;
  if (uVar7 < 0x1000) {
    uVar10 = uVar7;
  }
  if (POPCOUNT((int)uVar10) != 1) {
    uVar10 = 1L << ((ulong)(byte)-(char)LZCOUNT(uVar10) & 0x3f);
    if (uVar7 == 0) {
      uVar10 = 1;
    }
  }
  auVar3 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,lVar5);
  dVar14 = 1.0;
  uVar7 = 0xffffffffffffffff;
  while (uVar8 = uVar10 - uVar7, uVar10 < uVar7) {
    dVar14 = dVar14 + -0.01;
    uVar7 = 0;
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      uVar8 = 1;
      auVar13 = vcvtusi2sd_avx512f(in_XMM4,freqs->_M_elems[lVar5]);
      dVar2 = ((double)(long)uVar10 / auVar3._0_8_) * dVar14 * auVar13._0_8_;
      in_ZMM3 = ZEXT864((ulong)dVar2);
      uVar11 = (uint)dVar2;
      if ((short)uVar11 != 0) {
        uVar8 = (ulong)uVar11;
      }
      if (freqs->_M_elems[lVar5] == 0) {
        uVar8 = (ulong)uVar11;
      }
      __return_storage_ptr__->_M_elems[lVar5] = (unsigned_short)uVar8;
      uVar7 = uVar7 + (uVar8 & 0xffff);
    }
  }
  for (lVar5 = 0xff; lVar5 != -1; lVar5 = lVar5 + -1) {
    uVar4 = __return_storage_ptr__->_M_elems[lVar5];
    if ((ulong)uVar4 != 0) {
      auVar3 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar7);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = ((double)(long)uVar8 / auVar3._0_8_) * (double)uVar4;
      uVar10 = vcvttsd2usi_avx512f(auVar13);
      if (uVar8 < uVar10) {
        uVar10 = uVar8;
      }
      uVar7 = uVar7 - uVar4;
      uVar8 = uVar8 - uVar10;
      __return_storage_ptr__->_M_elems[lVar5] = (short)uVar10 + uVar4;
    }
  }
  if (uVar8 != 0) {
    uVar4 = 0;
    lVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      uVar1 = __return_storage_ptr__->_M_elems[lVar6];
      bVar12 = uVar4 < uVar1;
      if (uVar4 <= uVar1) {
        uVar4 = uVar1;
      }
      if (bVar12) {
        lVar5 = lVar6;
      }
    }
    __return_storage_ptr__->_M_elems[lVar5] = __return_storage_ptr__->_M_elems[lVar5] + (short)uVar8
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<uint16_t, constants::MAX_SIGMA> adjust_freqs(
    const std::array<uint64_t, constants::MAX_SIGMA>& freqs)
{
    std::array<uint16_t, constants::MAX_SIGMA> adj_freqs { 0 };
    size_t uniq_syms = 0;
    size_t initial_sum = 0;
    for (size_t i = 0; i < constants::MAX_SIGMA; i++) {
        initial_sum += freqs[i];
        uniq_syms += freqs[i] != 0;
    }
    size_t target_frame_size = uniq_syms * constants::FRAME_FACTOR;
    if (target_frame_size > constants::MAX_FRAME_SIZE) {
        target_frame_size = constants::MAX_FRAME_SIZE;
    }
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    double c = double(target_frame_size) / double(initial_sum);
    size_t cur_frame_size = std::numeric_limits<uint64_t>::max();
    double fudge = 1.0;
    while (cur_frame_size > target_frame_size) {
        fudge -= 0.01;
        cur_frame_size = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            adj_freqs[sym] = (fudge * double(freqs[sym]) * c);
            if (adj_freqs[sym] == 0 && freqs[sym] != 0)
                adj_freqs[sym] = 1;
            cur_frame_size += adj_freqs[sym];
        }
    }
    int64_t excess = target_frame_size - cur_frame_size;
    for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
        auto ncnt = adj_freqs[constants::MAX_SIGMA - sym - 1];
        if (ncnt == 0)
            continue;
        double ratio = double(excess) / double(cur_frame_size);
        size_t adder = size_t(ratio * double(ncnt));
        if (adder > excess) {
            adder = excess;
        }
        excess -= adder;
        cur_frame_size -= ncnt;
        adj_freqs[constants::MAX_SIGMA - sym - 1] += adder;
    }
    if (excess != 0) {
        size_t max_freq = 0;
        size_t max_sym = 0;
        for (size_t sym = 0; sym < constants::MAX_SIGMA; sym++) {
            if (adj_freqs[sym] > max_freq) {
                max_freq = adj_freqs[sym];
                max_sym = sym;
            }
        }
        adj_freqs[max_sym] += excess;
    }
    return adj_freqs;
}